

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_read_chunk(p_ply ply,void *anybuffer,size_t size)

{
  size_t sVar1;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  size_t i;
  char *buffer;
  ulong local_30;
  
  local_30 = 0;
  do {
    while( true ) {
      if (in_RDX <= local_30) {
        return 1;
      }
      if (*(ulong *)(in_RDI + 0x2058) <= *(ulong *)(in_RDI + 0x2048)) break;
      *(undefined1 *)(in_RSI + local_30) =
           *(undefined1 *)(in_RDI + 0x48 + *(long *)(in_RDI + 0x2048));
      *(long *)(in_RDI + 0x2048) = *(long *)(in_RDI + 0x2048) + 1;
      local_30 = local_30 + 1;
    }
    *(undefined8 *)(in_RDI + 0x2048) = 0;
    sVar1 = fread((void *)(in_RDI + 0x48),1,0x2000,*(FILE **)(in_RDI + 0x38));
    *(size_t *)(in_RDI + 0x2058) = sVar1;
  } while (*(long *)(in_RDI + 0x2058) != 0);
  return 0;
}

Assistant:

static int ply_read_chunk(p_ply ply, void *anybuffer, size_t size) {
    char *buffer = (char *) anybuffer;
    size_t i = 0;
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    assert(ply->buffer_first <= ply->buffer_last);
    while (i < size) {
        if (ply->buffer_first < ply->buffer_last) {
            buffer[i] = ply->buffer[ply->buffer_first];
            ply->buffer_first++;
            i++;
        } else {
            ply->buffer_first = 0;
            ply->buffer_last = fread(ply->buffer, 1, BUFFERSIZE, ply->fp);
            if (ply->buffer_last <= 0) return 0;
        }
    }
    return 1;
}